

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O2

sb_decision_t sb_check_block_reusing(fdb_kvs_handle *handle)

{
  superblock *psVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  sb_decision_t sVar5;
  sb_decision_t sVar6;
  
  psVar1 = handle->file->sb;
  sVar5 = SBD_NONE;
  sVar6 = SBD_NONE;
  if ((psVar1 != (superblock *)0x0) &&
     ((handle->file->status).super___atomic_base<unsigned_char>._M_i == '\0')) {
    uVar2 = (handle->file->config->block_reusing_threshold).super___atomic_base<unsigned_long>._M_i;
    sVar6 = sVar5;
    if ((0xffffffffffffff9c < uVar2 - 100) &&
       ((((uVar3 = (handle->file->pos).super___atomic_base<unsigned_long>._M_i,
          (handle->config).min_block_reuse_filesize <= uVar3 &&
          ((handle->file->config->num_keeping_headers).super___atomic_base<unsigned_long>._M_i +
           psVar1->min_live_hdr_revnum <
           (handle->cur_header_revnum).super___atomic_base<unsigned_long>._M_i)) &&
         (sVar4 = fdb_estimate_space_used(handle->fhandle), sVar4 - 1 < uVar3 && uVar3 != 0)) &&
        (sVar6 = SBD_NONE, uVar2 < ((uVar3 - sVar4) * 100) / uVar3)))) {
      if ((psVar1->bmp_size).super___atomic_base<unsigned_long>._M_i == 0) {
        sVar6 = SBD_RECLAIM;
      }
      else if (((handle->config).max_block_reusing_cycle == 0) ||
              ((psVar1->bmp_revnum).super___atomic_base<unsigned_long>._M_i <
               (handle->config).max_block_reusing_cycle)) {
        if (psVar1->num_free_blocks == 0) {
          sVar6 = (uint)(psVar1->rsv_bmp != (sb_rsv_bmp *)0x0) * 2 + SBD_RECLAIM;
        }
        else if ((((handle->config).enable_reusable_block_reservation == true) &&
                 (psVar1->num_free_blocks * 100 < psVar1->num_init_free_blocks * 10)) &&
                (0x1000000 < psVar1->num_init_free_blocks * (long)handle->file->config->blocksize))
        {
          sVar6 = SBD_RESERVE;
        }
      }
    }
  }
  return sVar6;
}

Assistant:

sb_decision_t sb_check_block_reusing(fdb_kvs_handle *handle)

{
    // start block reusing when
    // 1) if blocks are not reused yet in this file:
    //    when file size becomes larger than the threshold
    // 2) otherwise:
    //    when # free blocks decreases under the threshold

    uint64_t live_datasize;
    uint64_t filesize;
    uint64_t ratio;
    struct superblock *sb = handle->file->sb;

    if (!sb) {
        return SBD_NONE;
    }

    if (filemgr_get_file_status(handle->file) != FILE_NORMAL) {
        // being compacted file does not allow block reusing
        return SBD_NONE;
    }

    uint64_t block_reusing_threshold =
        atomic_get_uint64_t(&handle->file->config->block_reusing_threshold,
                            std::memory_order_relaxed);
    if (block_reusing_threshold == 0 || block_reusing_threshold >= 100) {
        // circular block reusing is disabled
        return SBD_NONE;
    }

    filesize = filemgr_get_pos(handle->file);
    if (filesize < handle->config.min_block_reuse_filesize) {
        return SBD_NONE;
    }

    // at least # keeping headers should exist
    // since the last block reusing
    if (handle->cur_header_revnum <=
        sb->min_live_hdr_revnum +
        atomic_get_uint64_t(&handle->file->config->num_keeping_headers,
                            std::memory_order_relaxed)) {
        return SBD_NONE;
    }

    live_datasize = fdb_estimate_space_used(handle->fhandle);
    if (filesize == 0 || live_datasize == 0 ||
        live_datasize > filesize) {
        return SBD_NONE;
    }

    ratio = (filesize - live_datasize) * 100 / filesize;

    if (ratio <= block_reusing_threshold) return SBD_NONE;

    if (!sb_bmp_exists(sb)) {
        // block reusing has not been started yet
        return SBD_RECLAIM;
    } else if ( handle->config.max_block_reusing_cycle &&
                sb->bmp_revnum >= handle->config.max_block_reusing_cycle ) {
        // Cannot exceed the max cycle.
        return SBD_NONE;
    }

    // stale blocks are already being reused before
    if (sb->num_free_blocks == 0) {
        if (sb->rsv_bmp) {
            // reserved bitmap exists
            return SBD_SWITCH;
        } else {
            // re-reclaim
            return SBD_RECLAIM;
        }
    } else if ( handle->config.enable_reusable_block_reservation &&
                ( sb->num_free_blocks * 100 <
                      sb->num_init_free_blocks * SB_PRE_RECLAIM_RATIO ) ) {
        if (sb->num_init_free_blocks * handle->file->config->blocksize >
            SB_MIN_BLOCK_REUSING_FILESIZE)  {
            return SBD_RESERVE;
        }
    }

    return SBD_NONE;
}